

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite_inl.h
# Opt level: O0

bool google::protobuf::internal::WireFormatLite::
     ReadPrimitive<int,(google::protobuf::internal::WireFormatLite::FieldType)17>
               (CodedInputStream *input,int32 *value)

{
  bool bVar1;
  int32 iVar2;
  uint32 local_24;
  int32 *piStack_20;
  uint32 temp;
  int32 *value_local;
  CodedInputStream *input_local;
  
  piStack_20 = value;
  value_local = (int32 *)input;
  bVar1 = io::CodedInputStream::ReadVarint32(input,&local_24);
  if (bVar1) {
    iVar2 = ZigZagDecode32(local_24);
    *piStack_20 = iVar2;
  }
  return bVar1;
}

Assistant:

inline bool WireFormatLite::ReadPrimitive<int32, WireFormatLite::TYPE_SINT32>(
    io::CodedInputStream* input,
    int32* value) {
  uint32 temp;
  if (!input->ReadVarint32(&temp)) return false;
  *value = ZigZagDecode32(temp);
  return true;
}